

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QOpenGLShader_*>::clear(QList<QOpenGLShader_*> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QPodArrayOps<QOpenGLShader_*> *this_00;
  __off_t __length;
  QArrayDataPointer<QOpenGLShader_*> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QOpenGLShader_*> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  qsizetype alloc;
  QArrayDataPointer<QOpenGLShader_*> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<QOpenGLShader_*> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<QOpenGLShader_*>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<QOpenGLShader_*>::needsDetach(in_RDI);
    if (bVar2) {
      qVar3 = -0x5555555555555556;
      alloc = -0x5555555555555556;
      pQVar4 = (QArrayDataPointer<QOpenGLShader_*> *)0xaaaaaaaaaaaaaaaa;
      QArrayDataPointer<QOpenGLShader_*>::allocatedCapacity(in_RDI);
      QArrayDataPointer<QOpenGLShader_*>::QArrayDataPointer(pQVar4,alloc,qVar3,option);
      QArrayDataPointer<QOpenGLShader_*>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<QOpenGLShader_*>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QPodArrayOps<QOpenGLShader_*> *)
                QArrayDataPointer<QOpenGLShader_*>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<QOpenGLShader_*>::truncate(this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }